

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool init::StartLogging(ArgsManager *args)

{
  bool bVar1;
  Logger *pLVar2;
  int64_t nTime;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char *args_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string in_stack_fffffffffffffee8;
  path config_file_path;
  string local_c8 [32];
  bilingual_str local_a8;
  bilingual_str local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar2 = LogInstance();
  if (pLVar2->m_print_to_file == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"-shrinkdebugfile",(allocator<char> *)&local_a8);
    pLVar2 = LogInstance();
    bVar1 = BCLog::Logger::DefaultShrinkDebugFile(pLVar2);
    bVar1 = ArgsManager::GetBoolArg(args,&local_68.original,bVar1);
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar1) {
      pLVar2 = LogInstance();
      BCLog::Logger::ShrinkDebugFile(pLVar2);
    }
  }
  pLVar2 = LogInstance();
  bVar1 = BCLog::Logger::StartLogging(pLVar2);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_c8,"Could not open debug log file %s",
               (allocator<char> *)&stack0xfffffffffffffef0);
    Untranslated(&local_a8,in_stack_fffffffffffffee8);
    pLVar2 = LogInstance();
    std::filesystem::__cxx11::path::string
              ((string *)&config_file_path,&(pLVar2->m_file_path).super_path);
    tinyformat::format<std::__cxx11::string>
              (&local_68,(tinyformat *)&local_a8,(bilingual_str *)&config_file_path,in_RCX);
    bVar1 = InitError(&local_68);
    bilingual_str::~bilingual_str(&local_68);
    std::__cxx11::string::~string((string *)&config_file_path);
    bilingual_str::~bilingual_str(&local_a8);
    std::__cxx11::string::~string(local_c8);
    goto LAB_00a761d1;
  }
  pLVar2 = LogInstance();
  if (pLVar2->m_log_timestamps == false) {
    nTime = GetTime();
    FormatISO8601DateTime_abi_cxx11_(&local_68.original,nTime);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init/common.cpp"
    ;
    source_file._M_len = 0x5f;
    logging_function._M_str = "StartLogging";
    logging_function._M_len = 0xc;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,0x77,ALL,Info,(ConstevalFormatString<1U>)0xe25f42,
               &local_68.original);
    std::__cxx11::string::~string((string *)&local_68);
  }
  GetDefaultDataDir();
  std::filesystem::__cxx11::path::string(&local_a8.original,(path *)&local_68);
  source_file_00._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init/common.cpp"
  ;
  source_file_00._M_len = 0x5f;
  logging_function_00._M_str = "StartLogging";
  logging_function_00._M_len = 0xc;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function_00,source_file_00,0x78,ALL,Info,(ConstevalFormatString<1U>)0xe25f54,
             &local_a8.original);
  std::__cxx11::string::~string((string *)&local_a8);
  std::filesystem::__cxx11::path::~path((path *)&local_68);
  ArgsManager::GetDataDirNet((path *)&local_68,&gArgs);
  std::filesystem::__cxx11::path::string(&local_a8.original,(path *)&local_68);
  source_file_01._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init/common.cpp"
  ;
  source_file_01._M_len = 0x5f;
  args_00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init/common.cpp";
  logging_function_01._M_str = "StartLogging";
  logging_function_01._M_len = 0xc;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function_01,source_file_01,0x79,ALL,Info,(ConstevalFormatString<1U>)0xe25f6f,
             &local_a8.original);
  std::__cxx11::string::~string((string *)&local_a8);
  std::filesystem::__cxx11::path::~path((path *)&local_68);
  ArgsManager::GetConfigFilePath((path *)&config_file_path.super_path,args);
  bVar1 = std::filesystem::exists(&config_file_path.super_path);
  if (bVar1) {
    std::filesystem::__cxx11::path::string(&local_68.original,&config_file_path.super_path);
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init/common.cpp"
    ;
    source_file_02._M_len = 0x5f;
    logging_function_02._M_str = "StartLogging";
    logging_function_02._M_len = 0xc;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_02,source_file_02,0x7e,ALL,Info,(ConstevalFormatString<1U>)0xe25f88,
               &local_68.original);
LAB_00a761b0:
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"-conf",(allocator<char> *)&local_a8);
    bVar1 = ArgsManager::IsArgSet(args,&local_68.original);
    std::__cxx11::string::~string((string *)&local_68);
    if (!bVar1) {
      std::filesystem::__cxx11::path::string(&local_68.original,&config_file_path.super_path);
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init/common.cpp"
      ;
      source_file_03._M_len = 0x5f;
      logging_function_03._M_str = "StartLogging";
      logging_function_03._M_len = 0xc;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_03,source_file_03,0x84,ALL,Info,
                 (ConstevalFormatString<1U>)0xe25fc5,&local_68.original);
      goto LAB_00a761b0;
    }
    _(&local_a8,(ConstevalStringLiteral)0xe25f99);
    std::filesystem::__cxx11::path::string
              ((string *)&stack0xfffffffffffffef0,&config_file_path.super_path);
    tinyformat::format<std::__cxx11::string>
              (&local_68,(tinyformat *)&local_a8,(bilingual_str *)&stack0xfffffffffffffef0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_00);
    InitWarning(&local_68);
    bilingual_str::~bilingual_str(&local_68);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
    bilingual_str::~bilingual_str(&local_a8);
  }
  ArgsManager::LogArgs(args);
  std::filesystem::__cxx11::path::~path(&config_file_path.super_path);
  bVar1 = true;
LAB_00a761d1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool StartLogging(const ArgsManager& args)
{
    if (LogInstance().m_print_to_file) {
        if (args.GetBoolArg("-shrinkdebugfile", LogInstance().DefaultShrinkDebugFile())) {
            // Do this first since it both loads a bunch of debug.log into memory,
            // and because this needs to happen before any other debug.log printing
            LogInstance().ShrinkDebugFile();
        }
    }
    if (!LogInstance().StartLogging()) {
            return InitError(strprintf(Untranslated("Could not open debug log file %s"),
                fs::PathToString(LogInstance().m_file_path)));
    }

    if (!LogInstance().m_log_timestamps)
        LogPrintf("Startup time: %s\n", FormatISO8601DateTime(GetTime()));
    LogPrintf("Default data directory %s\n", fs::PathToString(GetDefaultDataDir()));
    LogPrintf("Using data directory %s\n", fs::PathToString(gArgs.GetDataDirNet()));

    // Only log conf file usage message if conf file actually exists.
    fs::path config_file_path = args.GetConfigFilePath();
    if (fs::exists(config_file_path)) {
        LogPrintf("Config file: %s\n", fs::PathToString(config_file_path));
    } else if (args.IsArgSet("-conf")) {
        // Warn if no conf file exists at path provided by user
        InitWarning(strprintf(_("The specified config file %s does not exist"), fs::PathToString(config_file_path)));
    } else {
        // Not categorizing as "Warning" because it's the default behavior
        LogPrintf("Config file: %s (not found, skipping)\n", fs::PathToString(config_file_path));
    }

    // Log the config arguments to debug.log
    args.LogArgs();

    return true;
}